

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O2

void __thiscall SpanList::pushBack(SpanList *this,Span *pSpan)

{
  Span *pSVar1;
  Span *pSVar2;
  
  pSVar2 = this->list;
  if (pSVar2 == (Span *)0x0) {
    this->list = pSpan;
    pSVar2 = pSpan;
  }
  else {
    pSVar1 = pSVar2->prev;
    pSVar1->next = pSpan;
    pSpan->prev = pSVar1;
  }
  pSVar2->prev = pSpan;
  pSpan->next = pSVar2;
  return;
}

Assistant:

void SpanList::pushBack(Span *pSpan) {
  // 先判断是否为空
  if (list == nullptr) {
    list = pSpan;
    list->prev = list;
    list->next = list;
  } else {
    list->prev->next = pSpan;
    pSpan->prev = list->prev;
    pSpan->next = list;
    list->prev = pSpan;
  }
}